

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_nbacc_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,void *buf,
              Integer *ld,void *alpha,Integer *nbhandle)

{
  Integer *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  Integer *in_R9;
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_ffffffffffffffa0;
  
  pnga_nbacc(*in_RCX,(Integer *)*in_RSI,(Integer *)*in_R8,(void *)*in_RDX,in_stack_ffffffffffffffa0,
             (void *)hi[1],in_R9);
  return;
}

Assistant:

void FATR ga_nbacc_(Integer *g_a, Integer *ilo, Integer *ihi,
                    Integer *jlo, Integer *jhi, void *buf, Integer *ld,
                    void *alpha, Integer *nbhandle)
{
  Integer lo[2], hi[2];
  lo[0]=*ilo;
  lo[1]=*jlo;
  hi[0]=*ihi;
  hi[1]=*jhi;
  wnga_nbacc(*g_a, lo, hi, buf, ld, alpha, nbhandle);
}